

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ios_prop.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  _Setprecision _Var2;
  _Setw _Var3;
  propery *ppVar4;
  ostream *poVar5;
  undefined8 uVar6;
  int iVar7;
  int passed;
  exception *e;
  stringstream ss2;
  stringstream ss_3;
  stringstream ss_2;
  stringstream ss_1;
  stringstream ss;
  ios_base *in_stack_fffffffffffff0e8;
  string *in_stack_fffffffffffff0f8;
  runtime_error *in_stack_fffffffffffff100;
  ios_base *in_stack_fffffffffffff118;
  allocator *paVar8;
  propery *in_stack_fffffffffffff120;
  allocator local_b21;
  string local_b20 [38];
  undefined1 local_afa;
  allocator local_af9;
  string local_af8 [32];
  locale local_ad8 [14];
  undefined1 local_aca;
  allocator local_ac9;
  string local_ac8 [38];
  undefined1 local_aa2;
  allocator local_aa1;
  string local_aa0 [38];
  undefined1 local_a7a;
  allocator local_a79;
  string local_a78 [38];
  undefined1 local_a52;
  allocator local_a51;
  string local_a50 [38];
  undefined1 local_a2a;
  allocator local_a29;
  string local_a28 [38];
  undefined1 local_a02;
  allocator local_a01;
  string local_a00 [38];
  undefined1 local_9da;
  allocator local_9d9;
  string local_9d8 [38];
  undefined1 local_9b2;
  allocator local_9b1;
  string local_9b0 [36];
  propery local_98c;
  long local_988 [49];
  stringstream local_800 [398];
  undefined1 local_672;
  allocator local_671;
  string local_670 [38];
  undefined1 local_64a;
  allocator local_649;
  string local_648 [38];
  undefined1 local_622;
  allocator local_621;
  string local_620 [36];
  propery local_5fc;
  stringstream local_5f8 [398];
  undefined1 local_46a;
  allocator local_469;
  string local_468 [38];
  undefined1 local_442;
  allocator local_441;
  string local_440 [38];
  undefined1 local_41a;
  allocator local_419;
  string local_418 [36];
  propery local_3f4;
  stringstream local_3f0 [398];
  undefined1 local_262;
  allocator local_261;
  string local_260 [38];
  undefined1 local_23a;
  allocator local_239;
  string local_238 [38];
  undefined1 local_212;
  allocator local_211;
  string local_210 [38];
  undefined1 local_1ea;
  allocator local_1e9;
  string local_1e8 [38];
  undefined1 local_1c2;
  allocator local_1c1;
  string local_1c0 [48];
  stringstream local_190 [396];
  undefined4 local_4;
  
  local_4 = 0;
  std::__cxx11::stringstream::stringstream(local_190);
  test_counter = test_counter + 1;
  bVar1 = booster::locale::impl::ios_prop<propery>::has(in_stack_fffffffffffff0e8);
  if (bVar1) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x26);
    poVar5 = std::operator<<(poVar5," !prop_type::has(ss)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar7 = error_counter + 1;
    bVar1 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar1) {
      local_1c2 = 1;
      uVar6 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1c0,"Error limits reached, stopping unit test",&local_1c1);
      booster::runtime_error::runtime_error(in_stack_fffffffffffff100,in_stack_fffffffffffff0f8);
      local_1c2 = 0;
      __cxa_throw(uVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  ppVar4 = booster::locale::impl::ios_prop<propery>::get((ios_base *)in_stack_fffffffffffff100);
  if (ppVar4->x != -1) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x27);
    poVar5 = std::operator<<(poVar5," prop_type::get(ss).x==-1");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar7 = error_counter + 1;
    bVar1 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar1) {
      local_1ea = 1;
      uVar6 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1e8,"Error limits reached, stopping unit test",&local_1e9);
      booster::runtime_error::runtime_error(in_stack_fffffffffffff100,in_stack_fffffffffffff0f8);
      local_1ea = 0;
      __cxa_throw(uVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  bVar1 = booster::locale::impl::ios_prop<propery>::has(in_stack_fffffffffffff0e8);
  if (!bVar1) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x28);
    poVar5 = std::operator<<(poVar5," prop_type::has(ss)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar7 = error_counter + 1;
    bVar1 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar1) {
      local_212 = 1;
      uVar6 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_210,"Error limits reached, stopping unit test",&local_211);
      booster::runtime_error::runtime_error(in_stack_fffffffffffff100,in_stack_fffffffffffff0f8);
      local_212 = 0;
      __cxa_throw(uVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if (counter != 1) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x29);
    poVar5 = std::operator<<(poVar5," counter==1");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar7 = error_counter + 1;
    bVar1 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar1) {
      local_23a = 1;
      uVar6 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_238,"Error limits reached, stopping unit test",&local_239);
      booster::runtime_error::runtime_error(in_stack_fffffffffffff100,in_stack_fffffffffffff0f8);
      local_23a = 0;
      __cxa_throw(uVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::stringstream::~stringstream(local_190);
  test_counter = test_counter + 1;
  if (counter != 0) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x2b);
    poVar5 = std::operator<<(poVar5," counter==0");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar7 = error_counter + 1;
    bVar1 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar1) {
      local_262 = 1;
      uVar6 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_260,"Error limits reached, stopping unit test",&local_261);
      booster::runtime_error::runtime_error(in_stack_fffffffffffff100,in_stack_fffffffffffff0f8);
      local_262 = 0;
      __cxa_throw(uVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::stringstream::stringstream(local_3f0);
  propery::propery(&local_3f4,1);
  booster::locale::impl::ios_prop<propery>::set(in_stack_fffffffffffff120,in_stack_fffffffffffff118)
  ;
  propery::~propery(&local_3f4);
  test_counter = test_counter + 1;
  if (counter != 1) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x2f);
    poVar5 = std::operator<<(poVar5," counter==1");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar7 = error_counter + 1;
    bVar1 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar1) {
      local_41a = 1;
      uVar6 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_418,"Error limits reached, stopping unit test",&local_419);
      booster::runtime_error::runtime_error(in_stack_fffffffffffff100,in_stack_fffffffffffff0f8);
      local_41a = 0;
      __cxa_throw(uVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  ppVar4 = booster::locale::impl::ios_prop<propery>::get((ios_base *)in_stack_fffffffffffff100);
  if (ppVar4->x != 1) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x30);
    poVar5 = std::operator<<(poVar5," prop_type::get(ss).x==1");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar7 = error_counter + 1;
    bVar1 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar1) {
      local_442 = 1;
      uVar6 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_440,"Error limits reached, stopping unit test",&local_441);
      booster::runtime_error::runtime_error(in_stack_fffffffffffff100,in_stack_fffffffffffff0f8);
      local_442 = 0;
      __cxa_throw(uVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::stringstream::~stringstream(local_3f0);
  test_counter = test_counter + 1;
  if (counter != 0) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x32);
    poVar5 = std::operator<<(poVar5," counter==0");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar7 = error_counter + 1;
    bVar1 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar1) {
      local_46a = 1;
      uVar6 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_468,"Error limits reached, stopping unit test",&local_469);
      booster::runtime_error::runtime_error(in_stack_fffffffffffff100,in_stack_fffffffffffff0f8);
      local_46a = 0;
      __cxa_throw(uVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::stringstream::stringstream(local_5f8);
  propery::propery(&local_5fc,1);
  booster::locale::impl::ios_prop<propery>::set(in_stack_fffffffffffff120,in_stack_fffffffffffff118)
  ;
  propery::~propery(&local_5fc);
  test_counter = test_counter + 1;
  if (counter != 1) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x36);
    poVar5 = std::operator<<(poVar5," counter==1");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar7 = error_counter + 1;
    bVar1 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar1) {
      local_622 = 1;
      uVar6 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_620,"Error limits reached, stopping unit test",&local_621);
      booster::runtime_error::runtime_error(in_stack_fffffffffffff100,in_stack_fffffffffffff0f8);
      local_622 = 0;
      __cxa_throw(uVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  ppVar4 = booster::locale::impl::ios_prop<propery>::get((ios_base *)in_stack_fffffffffffff100);
  if (ppVar4->x != 1) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x37);
    poVar5 = std::operator<<(poVar5," prop_type::get(ss).x==1");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar7 = error_counter + 1;
    bVar1 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar1) {
      local_64a = 1;
      uVar6 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_648,"Error limits reached, stopping unit test",&local_649);
      booster::runtime_error::runtime_error(in_stack_fffffffffffff100,in_stack_fffffffffffff0f8);
      local_64a = 0;
      __cxa_throw(uVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::stringstream::~stringstream(local_5f8);
  test_counter = test_counter + 1;
  if (counter != 0) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x39);
    poVar5 = std::operator<<(poVar5," counter==0");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar7 = error_counter + 1;
    bVar1 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar1) {
      local_672 = 1;
      uVar6 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_670,"Error limits reached, stopping unit test",&local_671);
      booster::runtime_error::runtime_error(in_stack_fffffffffffff100,in_stack_fffffffffffff0f8);
      local_672 = 0;
      __cxa_throw(uVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::stringstream::stringstream(local_800);
  std::__cxx11::stringstream::stringstream((stringstream *)local_988);
  propery::propery(&local_98c,2);
  booster::locale::impl::ios_prop<propery>::set(in_stack_fffffffffffff120,in_stack_fffffffffffff118)
  ;
  propery::~propery(&local_98c);
  std::ios::copyfmt((ios *)((long)local_988 + *(long *)(local_988[0] + -0x18)));
  test_counter = test_counter + 1;
  ppVar4 = booster::locale::impl::ios_prop<propery>::get((ios_base *)in_stack_fffffffffffff100);
  if (ppVar4->x != 2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x3e);
    poVar5 = std::operator<<(poVar5," prop_type::get(ss).x==2");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar7 = error_counter + 1;
    bVar1 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar1) {
      local_9b2 = 1;
      uVar6 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_9b0,"Error limits reached, stopping unit test",&local_9b1);
      booster::runtime_error::runtime_error(in_stack_fffffffffffff100,in_stack_fffffffffffff0f8);
      local_9b2 = 0;
      __cxa_throw(uVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  bVar1 = booster::locale::impl::ios_prop<propery>::has(in_stack_fffffffffffff0e8);
  if (!bVar1) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x3f);
    poVar5 = std::operator<<(poVar5," prop_type::has(ss2)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar7 = error_counter + 1;
    bVar1 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar1) {
      local_9da = 1;
      uVar6 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_9d8,"Error limits reached, stopping unit test",&local_9d9);
      booster::runtime_error::runtime_error(in_stack_fffffffffffff100,in_stack_fffffffffffff0f8);
      local_9da = 0;
      __cxa_throw(uVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  bVar1 = booster::locale::impl::ios_prop<propery>::has(in_stack_fffffffffffff0e8);
  if (!bVar1) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x40);
    poVar5 = std::operator<<(poVar5," prop_type::has(ss)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar7 = error_counter + 1;
    bVar1 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar1) {
      local_a02 = 1;
      uVar6 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a00,"Error limits reached, stopping unit test",&local_a01);
      booster::runtime_error::runtime_error(in_stack_fffffffffffff100,in_stack_fffffffffffff0f8);
      local_a02 = 0;
      __cxa_throw(uVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  ppVar4 = booster::locale::impl::ios_prop<propery>::get((ios_base *)in_stack_fffffffffffff100);
  if (ppVar4->x != 2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x41);
    poVar5 = std::operator<<(poVar5," prop_type::get(ss2).x==2");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar7 = error_counter + 1;
    bVar1 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar1) {
      local_a2a = 1;
      uVar6 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a28,"Error limits reached, stopping unit test",&local_a29);
      booster::runtime_error::runtime_error(in_stack_fffffffffffff100,in_stack_fffffffffffff0f8);
      local_a2a = 0;
      __cxa_throw(uVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  ppVar4 = booster::locale::impl::ios_prop<propery>::get((ios_base *)in_stack_fffffffffffff100);
  ppVar4->x = 3;
  test_counter = test_counter + 1;
  ppVar4 = booster::locale::impl::ios_prop<propery>::get((ios_base *)in_stack_fffffffffffff100);
  if (ppVar4->x != 3) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x43);
    poVar5 = std::operator<<(poVar5," prop_type::get(ss2).x==3");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar7 = error_counter + 1;
    bVar1 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar1) {
      local_a52 = 1;
      uVar6 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a50,"Error limits reached, stopping unit test",&local_a51);
      booster::runtime_error::runtime_error(in_stack_fffffffffffff100,in_stack_fffffffffffff0f8);
      local_a52 = 0;
      __cxa_throw(uVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  ppVar4 = booster::locale::impl::ios_prop<propery>::get((ios_base *)in_stack_fffffffffffff100);
  if (ppVar4->x != 2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x44);
    poVar5 = std::operator<<(poVar5," prop_type::get(ss).x==2");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar7 = error_counter + 1;
    bVar1 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar1) {
      local_a7a = 1;
      uVar6 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a78,"Error limits reached, stopping unit test",&local_a79);
      booster::runtime_error::runtime_error(in_stack_fffffffffffff100,in_stack_fffffffffffff0f8);
      local_a7a = 0;
      __cxa_throw(uVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if (counter != 2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x45);
    poVar5 = std::operator<<(poVar5," counter==2");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar7 = error_counter + 1;
    bVar1 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar1) {
      local_aa2 = 1;
      uVar6 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_aa0,"Error limits reached, stopping unit test",&local_aa1);
      booster::runtime_error::runtime_error(in_stack_fffffffffffff100,in_stack_fffffffffffff0f8);
      local_aa2 = 0;
      __cxa_throw(uVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if (imbued != 0) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x46);
    poVar5 = std::operator<<(poVar5," imbued==0");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar7 = error_counter + 1;
    bVar1 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar1) {
      local_aca = 1;
      uVar6 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_ac8,"Error limits reached, stopping unit test",&local_ac9);
      booster::runtime_error::runtime_error(in_stack_fffffffffffff100,in_stack_fffffffffffff0f8);
      local_aca = 0;
      __cxa_throw(uVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::locale::classic();
  std::ios::imbue(local_ad8);
  std::locale::~locale(local_ad8);
  test_counter = test_counter + 1;
  if (imbued != 1) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x48);
    poVar5 = std::operator<<(poVar5," imbued==1");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar7 = error_counter + 1;
    bVar1 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar1) {
      local_afa = 1;
      uVar6 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_af8,"Error limits reached, stopping unit test",&local_af9);
      booster::runtime_error::runtime_error(in_stack_fffffffffffff100,in_stack_fffffffffffff0f8);
      local_afa = 0;
      __cxa_throw(uVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_988);
  std::__cxx11::stringstream::~stringstream(local_800);
  test_counter = test_counter + 1;
  if (counter != 0) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x4a);
    poVar5 = std::operator<<(poVar5," counter==0");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar7 = error_counter + 1;
    bVar1 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar1) {
      uVar6 = __cxa_allocate_exception(0x30);
      paVar8 = &local_b21;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b20,"Error limits reached, stopping unit test",paVar8);
      booster::runtime_error::runtime_error(in_stack_fffffffffffff100,in_stack_fffffffffffff0f8);
      __cxa_throw(uVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  iVar7 = test_counter - error_counter;
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)&std::cout,"Passed ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar7);
  poVar5 = std::operator<<(poVar5," tests");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  if (0 < error_counter) {
    poVar5 = std::operator<<((ostream *)&std::cout,"Failed ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,error_counter);
    poVar5 = std::operator<<(poVar5," tests");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  poVar5 = std::operator<<((ostream *)&std::cout," ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::fixed);
  _Var2 = std::setprecision(1);
  poVar5 = std::operator<<(poVar5,_Var2);
  _Var3 = std::setw(5);
  poVar5 = std::operator<<(poVar5,_Var3);
  poVar5 = (ostream *)
           std::ostream::operator<<(poVar5,((double)iVar7 * 100.0) / (double)test_counter);
  poVar5 = std::operator<<(poVar5,"% of tests completed sucsessefully");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  return (uint)(error_counter != 0);
}

Assistant:

int main()
{
    try {
        {
            std::stringstream ss;
            TEST(!prop_type::has(ss));
            TEST(prop_type::get(ss).x==-1);
            TEST(prop_type::has(ss));
            TEST(counter==1);
        }
        TEST(counter==0);
        {
            std::stringstream ss;
            prop_type::set(propery(1),ss);
            TEST(counter==1);
            TEST(prop_type::get(ss).x==1);
        }
        TEST(counter==0);
        {
            std::stringstream ss;
            prop_type::set(propery(1),ss);
            TEST(counter==1);
            TEST(prop_type::get(ss).x==1);
        }
        TEST(counter==0);
        {
            std::stringstream ss,ss2;
            prop_type::set(propery(2),ss);
            ss2.copyfmt(ss);
            TEST(prop_type::get(ss).x==2);
            TEST(prop_type::has(ss2));
            TEST(prop_type::has(ss));
            TEST(prop_type::get(ss2).x==2);
            prop_type::get(ss2).x=3;
            TEST(prop_type::get(ss2).x==3);
            TEST(prop_type::get(ss).x==2);
            TEST(counter==2);
            TEST(imbued==0);
            ss2.imbue(std::locale::classic());
            TEST(imbued==1);
        }
        TEST(counter==0);
    }catch(std::exception const &e) {
        std::cerr << "Fail:" << e.what() << std::endl;
        return EXIT_FAILURE;
    }
    FINALIZE();
    return 0;
}